

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O3

void square_set_feat(chunk_conflict *c,loc grid,wchar_t feat)

{
  _Bool _Var1;
  square *psVar2;
  long lVar3;
  
  _Var1 = square_in_bounds(c,grid);
  if (!_Var1) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave-square.c"
                  ,0x4d9,"void square_set_feat(struct chunk *, struct loc, int)");
  }
  psVar2 = square(c,grid);
  if ((ulong)psVar2->feat != 0) {
    c->feat_count[psVar2->feat] = c->feat_count[psVar2->feat] + -1;
  }
  if (feat == L'\0') {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)feat;
    c->feat_count[lVar3] = c->feat_count[lVar3] + 1;
  }
  c->squares[(long)grid >> 0x20][grid.x].feat = (uint8_t)feat;
  _Var1 = flag_has_dbg(f_info[lVar3].flags,4,0x1e,"f_info[feat].flags","TF_BRIGHT");
  if (_Var1) {
    psVar2 = square(c,grid);
    flag_on_dbg(psVar2->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
  }
  if (character_dungeon == true) {
    _Var1 = square_player_trap_allowed((chunk *)c,grid);
    if (!_Var1) {
      square_remove_all_traps((chunk *)c,grid);
    }
    square_note_spot((chunk *)c,grid);
    square_light_spot((chunk *)c,grid);
    return;
  }
  psVar2 = square(c,grid);
  flag_off(psVar2->info,3,0xb);
  psVar2 = square(c,grid);
  flag_off(psVar2->info,3,0xc);
  psVar2 = square(c,grid);
  flag_off(psVar2->info,3,0xd);
  return;
}

Assistant:

void square_set_feat(struct chunk *c, struct loc grid, int feat)
{
	int current_feat;

	assert(square_in_bounds(c, grid));
	current_feat = square(c, grid)->feat;

	/* Track changes */
	if (current_feat) c->feat_count[current_feat]--;
	if (feat) c->feat_count[feat]++;

	/* Make the change */
	c->squares[grid.y][grid.x].feat = feat;

	/* Light bright terrain */
	if (feat_is_bright(feat)) {
		sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
	}

	/* Make the new terrain feel at home */
	if (character_dungeon) {
		/* Remove traps if necessary */
		if (!square_player_trap_allowed(c, grid))
			square_destroy_trap(c, grid);

		square_note_spot(c, grid);
		square_light_spot(c, grid);
	} else {
		/* Make sure no incorrect wall flags set for dungeon generation */
		sqinfo_off(square(c, grid)->info, SQUARE_WALL_INNER);
		sqinfo_off(square(c, grid)->info, SQUARE_WALL_OUTER);
		sqinfo_off(square(c, grid)->info, SQUARE_WALL_SOLID);
	}
}